

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O1

QRect __thiscall QCommandLinkButtonPrivate::titleRect(QCommandLinkButtonPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QAbstractButton *this_00;
  QWidgetData *pQVar5;
  uint uVar6;
  int iVar7;
  int extraout_var;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QFontMetrics fm;
  QSize local_58;
  undefined1 *local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractButton **)
             &(this->super_QPushButtonPrivate).super_QAbstractButtonPrivate.super_QWidgetPrivate.
              field_0x8;
  pQVar5 = (this_00->super_QWidget).data;
  iVar1 = (pQVar5->crect).x2.m_i;
  iVar2 = (pQVar5->crect).x1.m_i;
  iVar3 = (pQVar5->crect).y1.m_i;
  iVar4 = (pQVar5->crect).y2.m_i;
  uVar6 = textOffset(this);
  if ((this->description).d.size == 0) {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    titleFont((QCommandLinkButtonPrivate *)&stack0xffffffffffffffb8);
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_50,(QFont *)&stack0xffffffffffffffb8);
    QFont::~QFont((QFont *)&stack0xffffffffffffffb8);
    QAbstractButton::icon((QAbstractButton *)&stack0xffffffffffffffb8);
    local_58 = QAbstractButton::iconSize(this_00);
    QIcon::actualSize((QSize *)&stack0xffffffffffffffb8,(Mode)&local_58,On);
    iVar7 = QFontMetrics::height();
    iVar8 = (extraout_var - iVar7) / 2;
    if ((extraout_var - iVar7) / 2 < 1) {
      iVar8 = 0;
    }
    QIcon::~QIcon((QIcon *)&stack0xffffffffffffffb8);
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_50);
    uVar9 = (ulong)(iVar8 + 10) << 0x20;
  }
  else {
    uVar9 = 0xa00000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar10.y2.m_i = iVar4 - iVar3;
    QVar10.x2.m_i = (iVar1 - iVar2) + -4;
    QVar10.x1.m_i = (int)(uVar9 | uVar6);
    QVar10.y1.m_i = (int)((uVar9 | uVar6) >> 0x20);
    return QVar10;
  }
  __stack_chk_fail();
}

Assistant:

QRect QCommandLinkButtonPrivate::titleRect() const
{
    Q_Q(const QCommandLinkButton);
    QRect r = q->rect().adjusted(textOffset(), topMargin(), -rightMargin(), 0);
    if (description.isEmpty())
    {
        QFontMetrics fm(titleFont());
        r.setTop(r.top() + qMax(0, (q->icon().actualSize(q->iconSize()).height()
                 - fm.height()) / 2));
    }

    return r;
}